

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_grp.cpp
# Opt level: O3

FResourceFile * CheckGRP(char *filename,FileReader *file,bool quiet)

{
  bool bVar1;
  FUncompressedFile *this;
  char head [12];
  long local_34;
  int local_2c;
  
  if (0xb < file->Length) {
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&local_34,0xc);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
    if (local_2c != 0x6e616d72 || local_34 != 0x65766c69536e654b) {
      return (FResourceFile *)0x0;
    }
    this = (FUncompressedFile *)operator_new(0x28);
    FUncompressedFile::FUncompressedFile(this,filename,file);
    (this->super_FResourceFile)._vptr_FResourceFile = (_func_int **)&PTR__FUncompressedFile_00709258
    ;
    this->Lumps = (FUncompressedLump *)0x0;
    bVar1 = FGrpFile::Open((FGrpFile *)this,quiet);
    if (bVar1) {
      return &this->super_FResourceFile;
    }
    (this->super_FResourceFile).Reader = (FileReader *)0x0;
    (*(this->super_FResourceFile)._vptr_FResourceFile[1])(this);
  }
  return (FResourceFile *)0x0;
}

Assistant:

FResourceFile *CheckGRP(const char *filename, FileReader *file, bool quiet)
{
	char head[12];

	if (file->GetLength() >= 12)
	{
		file->Seek(0, SEEK_SET);
		file->Read(&head, 12);
		file->Seek(0, SEEK_SET);
		if (!memcmp(head, "KenSilverman", 12))
		{
			FResourceFile *rf = new FGrpFile(filename, file);
			if (rf->Open(quiet)) return rf;

			rf->Reader = NULL; // to avoid destruction of reader
			delete rf;
		}
	}
	return NULL;
}